

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 in_RSI;
  ostream *in_RDI;
  TestSuite *test_suite_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2_1;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int total_tests;
  string kTestsuites;
  TestSuite *in_stack_00000288;
  ostream *in_stack_00000290;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_fffffffffffffe98;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  *in_stack_fffffffffffffea0;
  allocator<char> *streamable;
  allocator<char> *in_stack_fffffffffffffed0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_110;
  undefined8 local_108;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [39];
  allocator<char> local_89;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_58;
  undefined8 local_50;
  int local_48;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10;
  ostream *local_8;
  
  __s = &local_31;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)__s,in_stack_fffffffffffffed0);
  std::allocator<char>::~allocator(&local_31);
  std::operator<<(local_8,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar3 = std::operator<<(local_8,"<");
  std::operator<<(poVar3,local_30);
  local_48 = 0;
  local_50 = local_10;
  local_58._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 (in_stack_fffffffffffffe98);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
            (in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffea0,
                       (__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator*(&local_58);
    iVar2 = TestSuite::total_test_count((TestSuite *)0x14d7fe);
    local_48 = iVar2 + local_48;
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_58);
  }
  streamable = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)__s,(allocator<char> *)poVar3);
  StreamableToString<int>((int *)streamable);
  OutputXmlAttribute(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)__s,(allocator<char> *)poVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)__s,(allocator<char> *)poVar3);
  OutputXmlAttribute(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::operator<<(local_8,">\n");
  local_108 = local_10;
  local_110._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 (in_stack_fffffffffffffe98);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
            (in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffea0,
                       (__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator*(&local_110);
    PrintXmlTestSuite(in_stack_00000290,in_stack_00000288);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_110);
  }
  poVar3 = std::operator<<(local_8,"</");
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (auto test_suite : test_suites) {
    PrintXmlTestSuite(stream, *test_suite);
  }
  *stream << "</" << kTestsuites << ">\n";
}